

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_mem clCreatePipe(cl_context context,cl_mem_flags flags,cl_uint pipe_packet_size,
                   cl_uint pipe_max_packets,cl_pipe_properties *properties,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  bool bVar2;
  CLIntercept *this;
  cl_mem p_Var3;
  time_point end;
  time_point local_70;
  cl_int localErrorCode;
  string local_60;
  uint64_t local_40;
  cl_mem_flags local_38;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreatePipe == (cl_api_clCreatePipe)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_mem)0x0;
  }
  local_40 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_flags_abi_cxx11_(&local_60,&g_pIntercept->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clCreatePipe",local_40,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
               context,local_60._M_dataplus._M_p,flags,(ulong)pipe_packet_size,
               (ulong)pipe_max_packets);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret != (cl_int *)0x0) || ((this->m_Config).NoErrors == false)) goto LAB_0012fc33;
  }
  else if (errcode_ret != (cl_int *)0x0) goto LAB_0012fc33;
  errcode_ret = &localErrorCode;
LAB_0012fc33:
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_70.__d.__r = (duration)0;
  }
  else {
    local_38 = flags;
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    flags = local_38;
  }
  p_Var3 = (*(this->m_Dispatch).clCreatePipe)
                     (context,flags,pipe_packet_size,pipe_max_packets,properties,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_40 &&
        (local_40 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      CLIntercept::updateHostTimingStats(this,"clCreatePipe",&local_60,local_70,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  bVar2 = (this->m_Config).ErrorLogging;
  if ((((bVar2 != false) || ((this->m_Config).ErrorAssert != false)) ||
      ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
    if (bVar2 != false) {
      CLIntercept::logError(this,"clCreatePipe",*errcode_ret);
    }
    if ((this->m_Config).ErrorAssert == true) {
      raise(5);
    }
    if ((this->m_Config).NoErrors == true) {
      *errcode_ret = 0;
    }
  }
  if ((p_Var3 != (cl_mem)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_MemObjects;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreatePipe",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    CLIntercept::chromeCallLoggingExit(this,"clCreatePipe",&local_60,false,0,local_70,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  return p_Var3;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreatePipe) (
    cl_context context,
    cl_mem_flags flags,
    cl_uint pipe_packet_size,
    cl_uint pipe_max_packets,
    const cl_pipe_properties* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreatePipe )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags,
            pipe_packet_size,
            pipe_max_packets );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreatePipe(
            context,
            flags,
            pipe_packet_size,
            pipe_max_packets,
            properties,
            errcode_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0] );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}